

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O1

iuStreamMessage * __thiscall
iutest::detail::iuStreamMessage::operator<<(iuStreamMessage *this,pair<int,_int> *value)

{
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  undefined1 local_198 [128];
  ios_base local_118 [264];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_198);
  iuUniversalPrinter<std::pair<int,_int>_>::Print(value,(iu_ostream *)(local_198 + 0x10));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base(local_118);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(this->m_stream).super_iu_stringstream.field_0x10,(char *)local_1b8,
             local_1b0);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  return this;
}

Assistant:

iuStreamMessage& operator << (const T& value)
    {
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
        m_stream << PrintToString(value);
#else
        m_stream << value;
#endif
        return *this;
    }